

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_pubkey_save(secp256k1_pubkey_conflict *pubkey,secp256k1_ge *ge)

{
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_50;
  
  secp256k1_ge_to_storage(&local_50,ge);
  *(uint64_t *)(pubkey->data + 0x30) = local_50.y.n[2];
  *(uint64_t *)(pubkey->data + 0x38) = local_50.y.n[3];
  *(uint64_t *)(pubkey->data + 0x20) = local_50.y.n[0];
  *(uint64_t *)(pubkey->data + 0x28) = local_50.y.n[1];
  *(uint64_t *)(pubkey->data + 0x10) = local_50.x.n[2];
  *(uint64_t *)(pubkey->data + 0x18) = local_50.x.n[3];
  *(uint64_t *)pubkey->data = local_50.x.n[0];
  *(uint64_t *)(pubkey->data + 8) = local_50.x.n[1];
  return;
}

Assistant:

static void secp256k1_pubkey_save(secp256k1_pubkey* pubkey, secp256k1_ge* ge) {
    if (sizeof(secp256k1_ge_storage) == 64) {
        secp256k1_ge_storage s;
        secp256k1_ge_to_storage(&s, ge);
        memcpy(&pubkey->data[0], &s, sizeof(s));
    } else {
        VERIFY_CHECK(!secp256k1_ge_is_infinity(ge));
        secp256k1_fe_normalize_var(&ge->x);
        secp256k1_fe_normalize_var(&ge->y);
        secp256k1_fe_get_b32(pubkey->data, &ge->x);
        secp256k1_fe_get_b32(pubkey->data + 32, &ge->y);
    }
}